

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

Variable __thiscall
LiteScript::CreateVariable(LiteScript *this,Memory *memory,int count,Variable *values)

{
  Object *this_00;
  uint *extraout_RDX;
  uint *puVar1;
  uint *extraout_RDX_00;
  Variable VVar2;
  undefined1 local_70 [36];
  uint local_4c;
  uint local_48;
  uint sz;
  uint i;
  Array *local_38;
  Array *a;
  Variable *local_28;
  Variable *values_local;
  Memory *pMStack_18;
  int count_local;
  Memory *memory_local;
  Variable *v;
  
  a._7_1_ = 0;
  local_28 = values;
  values_local._4_4_ = count;
  pMStack_18 = memory;
  memory_local = (Memory *)this;
  Memory::Create((Memory *)this,(Type *)memory);
  this_00 = Variable::operator->((Variable *)this);
  local_38 = Object::GetData<LiteScript::Array>(this_00);
  local_4c = values_local._4_4_;
  puVar1 = extraout_RDX;
  for (local_48 = 0; local_48 < local_4c; local_48 = local_48 + 1) {
    Array::operator[]((Array *)local_70,(uint)local_38);
    Variable::operator=((Variable *)(local_70 + 0x10),(Variable *)local_70);
    Variable::~Variable((Variable *)(local_70 + 0x10));
    Variable::~Variable((Variable *)local_70);
    puVar1 = extraout_RDX_00;
  }
  VVar2.nb_ref = puVar1;
  VVar2.obj = (Object *)this;
  return VVar2;
}

Assistant:

LiteScript::Variable LiteScript::CreateVariable(Memory &memory, int count, const Variable *values) {
    Variable v = memory.Create(Type::ARRAY);
    Array& a = v->GetData<Array>();
    for (unsigned int i = 0, sz = (unsigned int)count; i < sz; i++)
        a[i] = values[i];
    return v;
}